

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c
# Opt level: O1

edata_t * duckdb_je_arena_extent_alloc_large
                    (tsdn_t *tsdn,arena_t *arena,size_t usize,size_t alignment,_Bool zero)

{
  ulong uVar1;
  long lVar2;
  _Bool guarded;
  ehooks_t *peVar3;
  edata_t *peVar4;
  _Bool zero_00;
  size_t size;
  undefined7 in_register_00000081;
  tsd_t *tsd;
  uint uVar5;
  _Bool deferred_work_generated;
  szind_t local_40;
  undefined4 local_3c;
  ulong local_38;
  
  local_3c = (undefined4)CONCAT71(in_register_00000081,zero);
  deferred_work_generated = false;
  if (usize < 0x1001) {
    local_40 = (szind_t)duckdb_je_sz_size2index_tab[usize + 7 >> 3];
  }
  else {
    local_40 = sz_size2index_compute(usize);
  }
  size = duckdb_je_sz_large_pad + usize;
  peVar3 = duckdb_je_base_ehooks_get(arena->base);
  if (duckdb_je_opt_san_guard_large == 0) {
    guarded = false;
  }
  else {
    guarded = false;
    if ((tsdn != (tsdn_t *)0x0) &&
       (guarded = false,
       (extent_hooks_t *)(peVar3->ptr).repr == &duckdb_je_ehooks_default_extent_hooks)) {
      uVar1 = (tsdn->tsd).
              cant_access_tsd_items_directly_use_a_getter_or_setter_san_extents_until_guard_large;
      if (1 < uVar1) {
        (tsdn->tsd).
        cant_access_tsd_items_directly_use_a_getter_or_setter_san_extents_until_guard_large =
             uVar1 - 1;
      }
      guarded = false;
      if (((size + 0x2000 < 0x7000000000000001) && (alignment < 0x1001)) && (uVar1 == 1)) {
        (tsdn->tsd).
        cant_access_tsd_items_directly_use_a_getter_or_setter_san_extents_until_guard_large =
             duckdb_je_opt_san_guard_large;
        guarded = true;
      }
    }
  }
  zero_00 = (_Bool)(duckdb_je_opt_calloc_madvise_threshold <= usize & (byte)local_3c);
  peVar4 = duckdb_je_pa_alloc(tsdn,&arena->pa_shard,size,alignment,false,local_40,zero_00,guarded,
                              &deferred_work_generated);
  if (peVar4 == (edata_t *)0x0) {
    peVar4 = (edata_t *)0x0;
  }
  else {
    arena_large_malloc_stats_update(tsdn,arena,usize);
    if ((alignment < 0x1000) && (duckdb_je_sz_large_pad != 0)) {
      uVar5 = (int)alignment + 0x3fU & 0x1fc0;
      lVar2 = 0x3f;
      if (uVar5 != 0) {
        for (; uVar5 >> lVar2 == 0; lVar2 = lVar2 + -1) {
        }
      }
      if (tsdn == (tsdn_t *)0x0) {
        local_38 = (long)&local_38 * 0x5851f42d4c957f2d + 0x14057b7ef767814f;
      }
      else {
        local_38 = (tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_prng_state *
                   0x5851f42d4c957f2d + 0x14057b7ef767814f;
        (tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_prng_state = local_38;
      }
      local_38 = local_38 >> (0x73 - ((byte)lVar2 ^ 0x3f) & 0x3f);
      peVar4->e_addr = (void *)((long)peVar4->e_addr + (local_38 << ((byte)lVar2 & 0x3f)));
    }
    if ((zero_00 == false && (char)local_3c == '\x01') && (-1 < (short)peVar4->e_bits)) {
      switchD_0130b471::default
                (peVar4->e_addr,0,
                 *(size_t *)
                  ((long)duckdb_je_sz_index2size_tab +
                  (ulong)((uint)(peVar4->e_bits >> 0x11) & 0x7f8)));
    }
  }
  return peVar4;
}

Assistant:

edata_t *
arena_extent_alloc_large(tsdn_t *tsdn, arena_t *arena, size_t usize,
    size_t alignment, bool zero) {
	bool deferred_work_generated = false;
	szind_t szind = sz_size2index(usize);
	size_t esize = usize + sz_large_pad;

	bool guarded = san_large_extent_decide_guard(tsdn,
	    arena_get_ehooks(arena), esize, alignment);

	/*
	 * - if usize >= opt_calloc_madvise_threshold,
	 *     - pa_alloc(..., zero_override = zero, ...)
	 * - otherwise,
	 *     - pa_alloc(..., zero_override = false, ...)
	 *     - use memset() to zero out memory if zero == true.
	 */
	bool zero_override = zero && (usize >= opt_calloc_madvise_threshold);
	edata_t *edata = pa_alloc(tsdn, &arena->pa_shard, esize, alignment,
	    /* slab */ false, szind, zero_override, guarded,
	    &deferred_work_generated);

	if (edata == NULL) {
		return NULL;
	}

	if (config_stats) {
		arena_large_malloc_stats_update(tsdn, arena, usize);
	}
	if (sz_large_pad != 0) {
		arena_cache_oblivious_randomize(tsdn, arena, edata, alignment);
	}
	/*
	 * This branch should be put after the randomization so that the addr
	 * returned by edata_addr_get() has already be randomized,
	 * if cache_oblivious is enabled.
	 */
	if (zero && !zero_override && !edata_zeroed_get(edata)) {
		void *addr = edata_addr_get(edata);
		size_t usize = edata_usize_get(edata);
		memset(addr, 0, usize);
	}

	return edata;
}